

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O2

void __thiscall rcdiscover::SocketLinux::bindToDevice(SocketLinux *this,string *device)

{
  int iVar1;
  int *piVar2;
  OperationNotPermitted *this_00;
  SocketException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = setsockopt(this->sock_,1,0x19,(device->_M_dataplus)._M_p,
                     (socklen_t)device->_M_string_length);
  if (iVar1 != -1) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 1) {
    this_00 = (OperationNotPermitted *)__cxa_allocate_exception(0x10);
    OperationNotPermitted::OperationNotPermitted(this_00);
    __cxa_throw(this_00,&OperationNotPermitted::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (SocketException *)__cxa_allocate_exception(0x38);
  std::operator+(&local_60,"Error while binding to device \"",device);
  std::operator+(&local_40,&local_60,"\"");
  SocketException::SocketException(this_01,&local_40,*piVar2);
  __cxa_throw(this_01,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::bindToDevice(const std::string &device)
{
  if (::setsockopt(sock_,
                   SOL_SOCKET,
                   SO_BINDTODEVICE,
                   device.c_str(),
                   static_cast<socklen_t>(device.size())) == -1)
  {
    if (errno == 1)
    {
      throw OperationNotPermitted();
    }

    throw SocketException("Error while binding to device \"" + device + "\"",
                          errno);
  }
}